

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

TonkFile tonk_file_receive(TonkFile file,void *data,uint32_t bytes,FpTonkFileDone fp,void *context)

{
  TonkFile pTVar1;
  
  if (fp_tonk_file_receive != (fp_tonk_file_receive_t)0x0) {
    pTVar1 = (*fp_tonk_file_receive)(file,data,bytes,fp,context);
    return pTVar1;
  }
  return (TonkFile)0x0;
}

Assistant:

TonkFile tonk_file_receive(
    TonkFile     file,  ///< TonkFile to update (or null)
    const void*  data,  ///< Data received
    uint32_t    bytes,  ///< Bytes of data
    FpTonkFileDone fp,  ///< Callback function
    void*     context   ///< Context pointer
)
{
    if (!fp_tonk_file_receive) {
        return 0;
    }

    return fp_tonk_file_receive(
        file,
        data,
        bytes,
        fp,
        context);
}